

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_sockfd.c
# Opt level: O3

void sfd_close(void *arg)

{
  nni_aio *aio;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0xb0));
  if (*(char *)((long)arg + 0xa8) == '\0') {
    *(undefined1 *)((long)arg + 0xa8) = 1;
    do {
      aio = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x78));
      if (aio == (nni_aio *)0x0) {
        aio = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x90));
        if (aio == (nni_aio *)0x0) goto LAB_0013d030;
      }
      nni_aio_list_remove(aio);
      nni_aio_finish_error(aio,NNG_ECLOSED);
    } while( true );
  }
LAB_0013d03c:
  nni_mtx_unlock((nni_mtx *)((long)arg + 0xb0));
  return;
LAB_0013d030:
  nni_posix_pfd_close((nni_posix_pfd *)((long)arg + 0x38));
  goto LAB_0013d03c;
}

Assistant:

static void
sfd_close(void *arg)
{
	nni_sfd_conn *c = arg;
	nni_mtx_lock(&c->mtx);
	if (!c->closed) {
		nni_aio *aio;
		c->closed = true;
		while (((aio = nni_list_first(&c->readq)) != NULL) ||
		    ((aio = nni_list_first(&c->writeq)) != NULL)) {
			nni_aio_list_remove(aio);
			nni_aio_finish_error(aio, NNG_ECLOSED);
		}
		nni_posix_pfd_close(&c->pfd);
	}
	nni_mtx_unlock(&c->mtx);
}